

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

void __thiscall llvm::raw_null_ostream::~raw_null_ostream(raw_null_ostream *this)

{
  (this->super_raw_pwrite_stream).super_raw_ostream._vptr_raw_ostream =
       (_func_int **)&PTR__raw_null_ostream_001c3418;
  raw_ostream::flush((raw_ostream *)this);
  raw_ostream::~raw_ostream((raw_ostream *)this);
  return;
}

Assistant:

raw_null_ostream::~raw_null_ostream() {
#ifndef NDEBUG
  // ~raw_ostream asserts that the buffer is empty. This isn't necessary
  // with raw_null_ostream, but it's better to have raw_null_ostream follow
  // the rules than to change the rules just for raw_null_ostream.
  flush();
#endif
}